

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnNameEntry
          (BinaryReaderObjdumpPrepass *this,NameSectionSubsection type,Index index,string_view name)

{
  Index index_local;
  NameSectionSubsection type_local;
  BinaryReaderObjdumpPrepass *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  if (type == Table) {
    SetTableName(this,index,name);
  }
  else if (type == Global) {
    SetGlobalName(this,index,name);
  }
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result OnNameEntry(NameSectionSubsection type,
                     Index index,
                     string_view name) override {
    switch (type) {
      // TODO(sbc): remove OnFunctionName in favor of just using
      // OnNameEntry so that this works
      /*
      case NameSectionSubsection::Function:
        SetFunctionName(index, name);
        break;
      */
      case NameSectionSubsection::Global:
        SetGlobalName(index, name);
        break;
      case NameSectionSubsection::Table:
        SetTableName(index, name);
        break;
      default:
        break;
    }
    return Result::Ok;
  }